

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void pugi::impl::anon_unknown_0::text_output
               (xml_buffered_writer *writer,char_t *s,chartypex_t type,uint flags)

{
  if ((flags & 0x10) != 0) {
    xml_buffered_writer::write_string(writer,s);
    return;
  }
  if (*s == '\0') {
    return;
  }
  _GLOBAL__N_1::text_output();
  return;
}

Assistant:

PUGI__FN void text_output(xml_buffered_writer& writer, const char_t* s, chartypex_t type, unsigned int flags)
	{
		if (flags & format_no_escapes)
			writer.write_string(s);
		else
			text_output_escaped(writer, s, type, flags);
	}